

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

void __thiscall luna::Function::Accept(Function *this,GCObjectVisitor *v)

{
  pointer pLVar1;
  bool bVar2;
  ulong uVar3;
  reference ppFVar4;
  long *in_RSI;
  vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_> *in_RDI;
  UpvalueInfo *upvalue;
  iterator __end2_3;
  iterator __begin2_3;
  vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_> *__range2_3;
  Function *child;
  iterator __end2_2;
  iterator __begin2_2;
  vector<luna::Function_*,_std::allocator<luna::Function_*>_> *__range2_2;
  LocalVarInfo *var;
  iterator __end2_1;
  iterator __begin2_1;
  vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_> *__range2_1;
  Value *value;
  iterator __end2;
  iterator __begin2;
  vector<luna::Value,_std::allocator<luna::Value>_> *__range2;
  reference in_stack_ffffffffffffff70;
  GCObjectVisitor *in_stack_ffffffffffffff78;
  __normal_iterator<luna::Function::UpvalueInfo_*,_std::vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>_>
  in_stack_ffffffffffffff80;
  __normal_iterator<luna::Function_**,_std::vector<luna::Function_*,_std::allocator<luna::Function_*>_>_>
  local_60;
  vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_> *local_58;
  reference local_50;
  LocalVarInfo *local_48;
  __normal_iterator<luna::Function::LocalVarInfo_*,_std::vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>_>
  local_40;
  vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_> *local_38;
  reference local_30;
  Value *local_28;
  __normal_iterator<luna::Value_*,_std::vector<luna::Value,_std::allocator<luna::Value>_>_> local_20
  ;
  vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_> *local_18;
  long *local_10;
  
  local_10 = in_RSI;
  uVar3 = (**(code **)(*in_RSI + 8))();
  if ((uVar3 & 1) != 0) {
    if (in_RDI[7].
        super__Vector_base<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      pLVar1 = in_RDI[7].
               super__Vector_base<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (**(code **)&(((anon_union_8_9_8deb4486_for_Value_0 *)&pLVar1->name_)->str_->super_GCObject).
                   field_0x10)(pLVar1,local_10);
    }
    if (in_RDI[8].
        super__Vector_base<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      pLVar1 = in_RDI[8].
               super__Vector_base<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (**(code **)&(((anon_union_8_9_8deb4486_for_Value_0 *)&pLVar1->name_)->str_->super_GCObject).
                   field_0x10)(pLVar1,local_10);
    }
    local_18 = in_RDI + 3;
    local_20._M_current =
         (Value *)std::vector<luna::Value,_std::allocator<luna::Value>_>::begin
                            ((vector<luna::Value,_std::allocator<luna::Value>_> *)in_RDI);
    local_28 = (Value *)std::vector<luna::Value,_std::allocator<luna::Value>_>::end
                                  ((vector<luna::Value,_std::allocator<luna::Value>_> *)in_RDI);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<luna::Value_*,_std::vector<luna::Value,_std::allocator<luna::Value>_>_>
                               *)in_stack_ffffffffffffff70,
                              (__normal_iterator<luna::Value_*,_std::vector<luna::Value,_std::allocator<luna::Value>_>_>
                               *)in_RDI), bVar2) {
      local_30 = __gnu_cxx::
                 __normal_iterator<luna::Value_*,_std::vector<luna::Value,_std::allocator<luna::Value>_>_>
                 ::operator*(&local_20);
      Value::Accept((Value *)in_stack_ffffffffffffff80._M_current,in_stack_ffffffffffffff78);
      __gnu_cxx::
      __normal_iterator<luna::Value_*,_std::vector<luna::Value,_std::allocator<luna::Value>_>_>::
      operator++(&local_20);
    }
    local_38 = in_RDI + 4;
    local_40._M_current =
         (LocalVarInfo *)
         std::vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>::
         begin(in_RDI);
    local_48 = (LocalVarInfo *)
               std::
               vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>::
               end(in_RDI);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<luna::Function::LocalVarInfo_*,_std::vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>_>
                               *)in_stack_ffffffffffffff70,
                              (__normal_iterator<luna::Function::LocalVarInfo_*,_std::vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>_>
                               *)in_RDI), bVar2) {
      local_50 = __gnu_cxx::
                 __normal_iterator<luna::Function::LocalVarInfo_*,_std::vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>_>
                 ::operator*(&local_40);
      (*(local_50->name_->super_GCObject)._vptr_GCObject[2])(local_50->name_,local_10);
      __gnu_cxx::
      __normal_iterator<luna::Function::LocalVarInfo_*,_std::vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>_>
      ::operator++(&local_40);
    }
    local_58 = in_RDI + 5;
    local_60._M_current =
         (Function **)
         std::vector<luna::Function_*,_std::allocator<luna::Function_*>_>::begin
                   ((vector<luna::Function_*,_std::allocator<luna::Function_*>_> *)in_RDI);
    std::vector<luna::Function_*,_std::allocator<luna::Function_*>_>::end
              ((vector<luna::Function_*,_std::allocator<luna::Function_*>_> *)in_RDI);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<luna::Function_**,_std::vector<luna::Function_*,_std::allocator<luna::Function_*>_>_>
                               *)in_stack_ffffffffffffff70,
                              (__normal_iterator<luna::Function_**,_std::vector<luna::Function_*,_std::allocator<luna::Function_*>_>_>
                               *)in_RDI), bVar2) {
      ppFVar4 = __gnu_cxx::
                __normal_iterator<luna::Function_**,_std::vector<luna::Function_*,_std::allocator<luna::Function_*>_>_>
                ::operator*(&local_60);
      (*((*ppFVar4)->super_GCObject)._vptr_GCObject[2])(*ppFVar4,local_10);
      __gnu_cxx::
      __normal_iterator<luna::Function_**,_std::vector<luna::Function_*,_std::allocator<luna::Function_*>_>_>
      ::operator++(&local_60);
    }
    std::vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>::begin
              ((vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_> *)
               in_RDI);
    std::vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>::end
              ((vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_> *)
               in_RDI);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<luna::Function::UpvalueInfo_*,_std::vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>_>
                               *)in_stack_ffffffffffffff70,
                              (__normal_iterator<luna::Function::UpvalueInfo_*,_std::vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>_>
                               *)in_RDI), bVar2) {
      in_stack_ffffffffffffff70 =
           __gnu_cxx::
           __normal_iterator<luna::Function::UpvalueInfo_*,_std::vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>_>
           ::operator*((__normal_iterator<luna::Function::UpvalueInfo_*,_std::vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>_>
                        *)&stack0xffffffffffffff80);
      (*(in_stack_ffffffffffffff70->name_->super_GCObject)._vptr_GCObject[2])
                (in_stack_ffffffffffffff70->name_,local_10);
      __gnu_cxx::
      __normal_iterator<luna::Function::UpvalueInfo_*,_std::vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>_>
      ::operator++((__normal_iterator<luna::Function::UpvalueInfo_*,_std::vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>_>
                    *)&stack0xffffffffffffff80);
    }
  }
  return;
}

Assistant:

void Function::Accept(GCObjectVisitor *v)
    {
        if (v->Visit(this))
        {
            if (module_)
                module_->Accept(v);
            if (superior_)
                superior_->Accept(v);

            for (const auto &value : const_values_)
                value.Accept(v);

            for (const auto &var : local_vars_)
                var.name_->Accept(v);

            for (auto child : child_funcs_)
                child->Accept(v);

            for (const auto &upvalue : upvalues_)
                upvalue.name_->Accept(v);
        }
    }